

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O0

CURLcode smb_parse_url_path(connectdata *conn)

{
  char *pcVar1;
  char *local_50;
  char *local_40;
  char *slash;
  char *path;
  smb_request *req;
  Curl_easy *data;
  connectdata *pcStack_18;
  CURLcode result;
  connectdata *conn_local;
  
  data._4_4_ = 0;
  req = (smb_request *)conn->data;
  path = (char *)(((Curl_easy *)req)->req).protop;
  pcStack_18 = conn;
  data._4_4_ = Curl_urldecode((Curl_easy *)req,(((Curl_easy *)req)->state).path,0,&slash,
                              (size_t *)0x0,true);
  conn_local._4_4_ = data._4_4_;
  if (data._4_4_ == CURLE_OK) {
    if ((*slash == '/') || (*slash == '\\')) {
      local_50 = slash + 1;
    }
    else {
      local_50 = slash;
    }
    pcVar1 = (*Curl_cstrdup)(local_50);
    *(char **)(path + 8) = pcVar1;
    if (*(long *)(path + 8) == 0) {
      (*Curl_cfree)(slash);
      conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      local_40 = strchr(*(char **)(path + 8),0x2f);
      if (local_40 == (char *)0x0) {
        local_40 = strchr(*(char **)(path + 8),0x5c);
      }
      if (local_40 == (char *)0x0) {
        (*Curl_cfree)(slash);
        conn_local._4_4_ = CURLE_URL_MALFORMAT;
      }
      else {
        *local_40 = '\0';
        *(char **)(path + 0x10) = local_40 + 1;
        for (local_40 = local_40 + 1; *local_40 != '\0'; local_40 = local_40 + 1) {
          if (*local_40 == '/') {
            *local_40 = '\\';
          }
        }
        (*Curl_cfree)(slash);
        conn_local._4_4_ = CURLE_OK;
      }
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode smb_parse_url_path(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct smb_request *req = data->req.protop;
  char *path;
  char *slash;

  /* URL decode the path */
  result = Curl_urldecode(data, data->state.path, 0, &path, NULL, TRUE);
  if(result)
    return result;

  /* Parse the path for the share */
  req->share = strdup((*path == '/' || *path == '\\') ? path + 1 : path);
  if(!req->share) {
    free(path);

    return CURLE_OUT_OF_MEMORY;
  }

  slash = strchr(req->share, '/');
  if(!slash)
    slash = strchr(req->share, '\\');

  /* The share must be present */
  if(!slash) {
    free(path);

    return CURLE_URL_MALFORMAT;
  }

  /* Parse the path for the file path converting any forward slashes into
     backslashes */
  *slash++ = 0;
  req->path = slash;
  for(; *slash; slash++) {
    if(*slash == '/')
      *slash = '\\';
  }

  free(path);

  return CURLE_OK;
}